

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileCommand.cxx
# Opt level: O0

bool __thiscall cmFileCopier::CheckPermissions(cmFileCopier *this,string *arg,mode_t *permissions)

{
  cmCommand *this_00;
  bool bVar1;
  ostream *poVar2;
  string local_1d0;
  ostringstream local_1a0 [8];
  ostringstream e;
  mode_t *permissions_local;
  string *arg_local;
  cmFileCopier *this_local;
  
  bVar1 = std::operator==(arg,"OWNER_READ");
  if (bVar1) {
    *permissions = mode_owner_read | *permissions;
  }
  else {
    bVar1 = std::operator==(arg,"OWNER_WRITE");
    if (bVar1) {
      *permissions = mode_owner_write | *permissions;
    }
    else {
      bVar1 = std::operator==(arg,"OWNER_EXECUTE");
      if (bVar1) {
        *permissions = mode_owner_execute | *permissions;
      }
      else {
        bVar1 = std::operator==(arg,"GROUP_READ");
        if (bVar1) {
          *permissions = mode_group_read | *permissions;
        }
        else {
          bVar1 = std::operator==(arg,"GROUP_WRITE");
          if (bVar1) {
            *permissions = mode_group_write | *permissions;
          }
          else {
            bVar1 = std::operator==(arg,"GROUP_EXECUTE");
            if (bVar1) {
              *permissions = mode_group_execute | *permissions;
            }
            else {
              bVar1 = std::operator==(arg,"WORLD_READ");
              if (bVar1) {
                *permissions = mode_world_read | *permissions;
              }
              else {
                bVar1 = std::operator==(arg,"WORLD_WRITE");
                if (bVar1) {
                  *permissions = mode_world_write | *permissions;
                }
                else {
                  bVar1 = std::operator==(arg,"WORLD_EXECUTE");
                  if (bVar1) {
                    *permissions = mode_world_execute | *permissions;
                  }
                  else {
                    bVar1 = std::operator==(arg,"SETUID");
                    if (bVar1) {
                      *permissions = mode_setuid | *permissions;
                    }
                    else {
                      bVar1 = std::operator==(arg,"SETGID");
                      if (!bVar1) {
                        std::__cxx11::ostringstream::ostringstream(local_1a0);
                        poVar2 = std::operator<<((ostream *)local_1a0,this->Name);
                        poVar2 = std::operator<<(poVar2," given invalid permission \"");
                        poVar2 = std::operator<<(poVar2,(string *)arg);
                        std::operator<<(poVar2,"\".");
                        this_00 = &this->FileCommand->super_cmCommand;
                        std::__cxx11::ostringstream::str();
                        cmCommand::SetError(this_00,&local_1d0);
                        std::__cxx11::string::~string((string *)&local_1d0);
                        std::__cxx11::ostringstream::~ostringstream(local_1a0);
                        return false;
                      }
                      *permissions = mode_setgid | *permissions;
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return true;
}

Assistant:

bool CheckPermissions(std::string const& arg, mode_t& permissions)
    {
    if(arg == "OWNER_READ")         { permissions |= mode_owner_read; }
    else if(arg == "OWNER_WRITE")   { permissions |= mode_owner_write; }
    else if(arg == "OWNER_EXECUTE") { permissions |= mode_owner_execute; }
    else if(arg == "GROUP_READ")    { permissions |= mode_group_read; }
    else if(arg == "GROUP_WRITE")   { permissions |= mode_group_write; }
    else if(arg == "GROUP_EXECUTE") { permissions |= mode_group_execute; }
    else if(arg == "WORLD_READ")    { permissions |= mode_world_read; }
    else if(arg == "WORLD_WRITE")   { permissions |= mode_world_write; }
    else if(arg == "WORLD_EXECUTE") { permissions |= mode_world_execute; }
    else if(arg == "SETUID")        { permissions |= mode_setuid; }
    else if(arg == "SETGID")        { permissions |= mode_setgid; }
    else
      {
      std::ostringstream e;
      e << this->Name << " given invalid permission \"" << arg << "\".";
      this->FileCommand->SetError(e.str());
      return false;
      }
    return true;
    }